

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     local_exscan<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::plus<unsigned_long>>
               (long *begin,long *end,undefined8 *out)

{
  long lVar1;
  T tmp;
  long lVar2;
  long *plVar3;
  
  if (end != begin) {
    lVar2 = *begin;
    *out = 0;
    plVar3 = out + 1;
    for (begin = begin + 1; begin != end; begin = begin + 1) {
      lVar1 = *begin;
      *plVar3 = lVar2;
      plVar3 = plVar3 + 1;
      lVar2 = lVar1 + lVar2;
    }
  }
  return;
}

Assistant:

void local_exscan(InIterator begin, InIterator end, OutIterator out, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<OutIterator>::value_type T;

    // start from first element
    T val = *begin;
    *out = T();
    ++begin;
    ++out;

    // calculate the exclusive prefix sum
    while (begin != end) {
        T tmp = val;
        val = func(val,*begin);
        *out = tmp;
        ++begin;
        ++out;
    }
}